

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O0

int phf_keycmp<std::__cxx11::string>
              (phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *a,phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *b)

{
  __type_conflict _Var1;
  phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *b_local
  ;
  phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *a_local
  ;
  
  if (*b->n < *a->n) {
    a_local._4_4_ = -1;
  }
  else if (*a->n < *b->n) {
    a_local._4_4_ = 1;
  }
  else if (b->g < a->g) {
    a_local._4_4_ = -1;
  }
  else if (a->g < b->g) {
    a_local._4_4_ = 1;
  }
  else {
    _Var1 = std::operator==(&a->k,&b->k);
    if ((_Var1) && (a != b)) {
      _Var1 = std::operator==(&a->k,&b->k);
      if (((_Var1 ^ 0xffU) & 1) != 0) {
        abort();
      }
      __assert_fail("!(a->k == b->k)",
                    "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/contrib/phf/phf.cc"
                    ,0x1e4,
                    "int phf_keycmp(const phf_key<T> *, const phf_key<T> *) [T = std::basic_string<char>]"
                   );
    }
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int phf_keycmp(const phf_key<T> *a, const phf_key<T> *b) {
	if (*(a->n) > *(b->n))
		return -1;
	if (*(a->n) < *(b->n))
		return 1;
	if (a->g > b->g)
		return -1;
	if (a->g < b->g)
		return 1;

	/* duplicate key? */
	if (a->k == b->k && a != b) {
		assert(!(a->k == b->k));
		abort(); /* if NDEBUG defined */
	}

	return 0;
}